

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O2

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Invoke
               (BenchmarkContext *context,int64_t numSlots)

{
  long lVar1;
  __sighandler_t __handler;
  int __sig;
  long lVar2;
  bool bVar3;
  SignalType s;
  StorageArray<wigwag::token> c;
  HandlerType handler;
  IOperationProfilerPtr op;
  allocator local_81;
  SignalType local_80;
  StorageArray<wigwag::token> local_78;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  anon_class_16_2_8e986c60 local_38 [2];
  
  lVar1 = context->_iterationsCount;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_manager;
  local_80._impl._s._ptr._raw =
       (creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
        )(storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>
          )0x0;
  StorageArray<wigwag::token>::StorageArray(&local_78,numSlots);
  local_38[0].s = &local_80;
  local_38[0].handler = (HandlerType *)&local_68;
  StorageArray<wigwag::token>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Invoke(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (&local_78,local_38);
  std::__cxx11::string::string((string *)local_38,"invoke",&local_81);
  (*context->_vptr_BenchmarkContext[3])(local_48,context,local_38,numSlots * lVar1);
  std::__cxx11::string::~string((string *)local_38);
  lVar2 = 0;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  while( true ) {
    __sig = (int)context;
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) break;
    wigwag::
    signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
    ::operator()(&local_80);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  StorageArray<wigwag::token>::Destruct(&local_78);
  StorageArray<wigwag::token>::~StorageArray(&local_78);
  wigwag::
  signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
  ::~signal(&local_80,__sig,__handler);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

static void Invoke(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(numSlots);

            c.Construct([&]{ return s.connect(handler); });

            {
                auto op = context.Profile("invoke", numSlots * n);
                for (int64_t i = 0; i < n; ++i)
                    s();
            }

            c.Destruct();
        }